

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

void xmlHashScanFull(xmlHashTablePtr table,xmlHashScannerFull f,void *data)

{
  int iVar1;
  _xmlHashEntry *p_Var2;
  _xmlHashEntry *p_Var3;
  long lVar4;
  _xmlHashEntry *p_Var5;
  _xmlHashEntry *p_Var6;
  
  if (((f != (xmlHashScannerFull)0x0 && table != (xmlHashTablePtr)0x0) &&
      (table->table != (_xmlHashEntry *)0x0)) && (0 < table->size)) {
    lVar4 = 0;
    do {
      p_Var6 = table->table;
      if (p_Var6 != (_xmlHashEntry *)0x0 && p_Var6[lVar4].valid != 0) {
        p_Var6 = p_Var6 + lVar4;
        do {
          p_Var2 = p_Var6->next;
          iVar1 = table->nbElems;
          if (p_Var6->payload != (void *)0x0) {
            (*f)(p_Var6->payload,data,p_Var6->name,p_Var6->name2,p_Var6->name3);
          }
          p_Var5 = p_Var2;
          if ((iVar1 != table->nbElems) && (p_Var3 = table->table + lVar4, p_Var6 == p_Var3)) {
            if (p_Var3->valid == 0) {
              p_Var6 = (_xmlHashEntry *)0x0;
            }
            p_Var5 = p_Var6;
            if (p_Var3->next != p_Var2) {
              p_Var5 = p_Var3;
            }
          }
          p_Var6 = p_Var5;
        } while (p_Var5 != (_xmlHashEntry *)0x0);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < table->size);
  }
  return;
}

Assistant:

void
xmlHashScanFull(xmlHashTablePtr table, xmlHashScannerFull f, void *data) {
    int i, nb;
    xmlHashEntryPtr iter;
    xmlHashEntryPtr next;

    if (table == NULL)
	return;
    if (f == NULL)
	return;

    if (table->table) {
	for(i = 0; i < table->size; i++) {
	    if (table->table[i].valid == 0)
		continue;
	    iter = &(table->table[i]);
	    while (iter) {
		next = iter->next;
                nb = table->nbElems;
		if ((f != NULL) && (iter->payload != NULL))
		    f(iter->payload, data, iter->name,
		      iter->name2, iter->name3);
                if (nb != table->nbElems) {
                    /* table was modified by the callback, be careful */
                    if (iter == &(table->table[i])) {
                        if (table->table[i].valid == 0)
                            iter = NULL;
                        if (table->table[i].next != next)
			    iter = &(table->table[i]);
                    } else
		        iter = next;
                } else
		    iter = next;
	    }
	}
    }
}